

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.cc
# Opt level: O1

vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
* __thiscall
cpsm::str_split(vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                *__return_storage_ptr__,cpsm *this,string_ref str,char delimiter)

{
  pointer *ppbVar1;
  iterator iVar2;
  char *pcVar3;
  char *pcVar4;
  size_type n;
  char *pcVar5;
  basic_string_ref<char,_std::char_traits<char>_> local_50;
  basic_string_ref<char,_std::char_traits<char>_> local_40;
  
  local_50.len_ = (size_t)str.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.ptr_ = (char *)this;
  do {
    pcVar3 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<boost::detail::string_ref_traits_eq<char,std::char_traits<char>>>>
                       (local_50.ptr_,(char *)(local_50.len_ + (long)local_50.ptr_),(char)str.len_);
    pcVar4 = (char *)(local_50.len_ + (long)local_50.ptr_);
    n = (long)pcVar3 - (long)local_50.ptr_;
    if (n == 0xffffffffffffffff || pcVar3 == pcVar4) break;
    local_40 = boost::basic_string_ref<char,_std::char_traits<char>_>::substr(&local_50,0,n);
    iVar2._M_current =
         (__return_storage_ptr__->
         super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
      ::_M_realloc_insert<boost::basic_string_ref<char,std::char_traits<char>>>
                ((vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,iVar2,&local_40);
    }
    else {
      (iVar2._M_current)->ptr_ = local_40.ptr_;
      (iVar2._M_current)->len_ = local_40.len_;
      ppbVar1 = &(__return_storage_ptr__->
                 super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    pcVar5 = (char *)(n + 1);
    if (local_50.len_ < (char *)(n + 1)) {
      pcVar5 = (char *)local_50.len_;
    }
    local_50.ptr_ = local_50.ptr_ + (long)pcVar5;
    local_50.len_ = local_50.len_ + -(long)pcVar5;
  } while (n != 0xffffffffffffffff && pcVar3 != pcVar4);
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
    ::_M_realloc_insert<boost::basic_string_ref<char,std::char_traits<char>>const&>
              ((vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,iVar2,&local_50);
  }
  else {
    (iVar2._M_current)->ptr_ = local_50.ptr_;
    (iVar2._M_current)->len_ = local_50.len_;
    ppbVar1 = &(__return_storage_ptr__->
               super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<boost::string_ref> str_split(boost::string_ref str,
                                         char const delimiter) {
  std::vector<boost::string_ref> splits;
  while (true) {
    auto const dpos = str.find_first_of(delimiter);
    if (dpos == boost::string_ref::npos) {
      break;
    }
    splits.push_back(str.substr(0, dpos));
    str.remove_prefix(dpos+1);
  }
  splits.push_back(str);
  return splits;
}